

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_note_group(re_context *ctx,re_group_register *regs,re_state_id id,char *p)

{
  byte bVar1;
  re_group_register *prVar2;
  long lVar3;
  
  if (id != -1) {
    bVar1 = ctx->tuple_arr[id].flags;
    if (((bVar1 & 6) != 0) && (lVar3 = (long)ctx->tuple_arr[id].ch, lVar3 < 10)) {
      prVar2 = (re_group_register *)&regs[lVar3].end_ofs;
      if ((bVar1 & 2) != 0) {
        prVar2 = regs + lVar3;
      }
      prVar2->start_ofs = p;
    }
  }
  return;
}

Assistant:

static void re_note_group(re_context *ctx, re_group_register *regs,
                          re_state_id id, const char *p)
{
    int group_index;

    /*
     *   Check to see if this is a valid state and it's a group marker -
     *   if not, there's nothing to do 
     */
    if (id == RE_STATE_INVALID
        || !(ctx->tuple_arr[id].flags
             & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
        || (group_index = (int)ctx->tuple_arr[id].ch) >= RE_GROUP_REG_CNT)
        return;

    /*
     *   It's a valid group marker - note the appropriate register value 
     */
    if ((ctx->tuple_arr[id].flags & RE_STATE_GROUP_BEGIN) != 0)
        regs[group_index].start_ofs = p;
    else
        regs[group_index].end_ofs = p;
}